

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenerators::ParseCppFile
          (cmQtAutoGenerators *this,string *absFilename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *headerExtensions,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *includedMocs,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *includedUis)

{
  string *__return_storage_ptr__;
  string *filename;
  pointer pcVar1;
  _Alloc_hider string;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  char *pcVar6;
  undefined8 extraout_RAX;
  undefined7 uVar10;
  undefined4 extraout_var;
  undefined8 uVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  cmQtAutoGenerators *this_00;
  long lVar13;
  bool bVar14;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar15;
  string basename;
  string scannedFileBasename;
  string headerToMoc;
  string fileToMoc;
  string currentMoc;
  string macroName;
  string mocSubDir;
  string absPath;
  string ownMocUnderscoreFile;
  string contentsString;
  string ownMocHeaderFile;
  string ownDotMocFile;
  RegularExpression mocIncludeRegExp;
  string local_2a0;
  string local_280;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_260;
  undefined1 local_258 [72];
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  string local_160;
  key_type local_140;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [200];
  char *local_38;
  
  local_100._184_8_ = (char *)0x0;
  local_260 = &includedMocs->_M_t;
  local_198 = headerExtensions;
  cmsys::RegularExpression::compile
            ((RegularExpression *)local_100,
             "[\n][ \t]*#[ \t]*include[ \t]+[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]"
            );
  ReadAll(&local_160,absFilename);
  if (local_160._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AUTOGEN: warning: ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                        absFilename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": file is empty\n",0x10);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    goto LAB_00269c7b;
  }
  ParseForUic(this,absFilename,&local_160,includedUis);
  if ((this->MocExecutable)._M_string_length == 0) goto LAB_00269c7b;
  cmsys::SystemTools::GetRealPath((string *)local_1f8,absFilename,(string *)0x0);
  cmsys::SystemTools::GetFilenamePath(&local_280,(string *)local_1f8);
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_280,local_280._M_string_length,0,'\x01');
  local_1b8._0_8_ = &local_1a8;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_1a8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1a8._8_8_ = plVar5[3];
  }
  else {
    local_1a8._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_1b8._8_8_ = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_280,absFilename);
  local_1f8._8_8_ = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_1f8._0_8_ = &local_1e8;
  bVar2 = requiresMocing(&local_160,(string *)local_1f8);
  string._M_p = local_160._M_dataplus._M_p;
  local_180._M_p = (pointer)&local_170;
  local_178 = 0;
  local_170._M_local_buf[0] = '\0';
  local_120._M_p = (pointer)&local_110;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  pcVar6 = strstr(local_160._M_dataplus._M_p,"moc");
  bVar14 = true;
  if (pcVar6 == (char *)0x0) {
LAB_002699ab:
    uVar7 = 0;
  }
  else {
    bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_100,string._M_p);
    if (!bVar3) goto LAB_002699ab;
    local_190._8_8_ = 0;
    filename = (string *)(local_258 + 0x40);
    __return_storage_ptr__ = (string *)(local_258 + 0x20);
    local_190._M_allocated_capacity = 0;
    lVar13 = 0;
    do {
      if ((char *)local_100._8_8_ == (char *)0x0) {
        local_258._64_8_ = &local_208;
        local_210 = (pointer)0x0;
        local_208._M_local_buf[0] = '\0';
      }
      else {
        local_258._64_8_ = &local_208;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)filename,local_100._8_8_,local_100._88_8_);
      }
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_2a0,filename);
      iVar4 = strncmp(local_2a0._M_dataplus._M_p,"moc_",4);
      if (iVar4 == 0) {
        std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_2a0);
        std::__cxx11::string::operator=((string *)&local_2a0,(string *)__return_storage_ptr__);
        if ((undefined1 *)local_258._32_8_ != local_258 + 0x30) {
          operator_delete((void *)local_258._32_8_,local_258._48_8_ + 1);
        }
        extractSubDir(__return_storage_ptr__,(string *)local_1b8,filename);
        findMatchingHeader((string *)local_1d8,(string *)local_1b8,__return_storage_ptr__,&local_2a0
                           ,local_198);
        if (local_1d8._8_8_ == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"AUTOGEN: error: ",0x10);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                              absFilename->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": The file ",0xb);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"includes the moc file \"",0x17)
          ;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)local_258._64_8_,(long)local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\", ",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"but could not find header \"",0x1b);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
          this_00 = (cmQtAutoGenerators *)local_258;
          local_258[0] = 0x7b;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)this_00,1);
          Join((string *)local_258,this_00,local_198,',');
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(char *)CONCAT71(local_258._1_7_,local_258[0]),local_258._8_8_)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}\" ",3);
          if ((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]) != local_258 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]),
                            local_258._16_8_ + 1);
          }
          if (local_258._40_8_ == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"in ",3);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1b8._0_8_,local_1b8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"neither in ",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_1b8._0_8_,local_1b8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," nor in ",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_258._32_8_,local_258._40_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          std::endl<char,std::char_traits<char>>(poVar8);
          goto LAB_00269eb6;
        }
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_260,(key_type *)local_1d8);
        std::__cxx11::string::_M_assign((string *)pmVar9);
        if (local_2a0._M_string_length == local_280._M_string_length) {
          if (local_2a0._M_string_length != 0) {
            iVar4 = bcmp(local_2a0._M_dataplus._M_p,local_280._M_dataplus._M_p,
                         local_2a0._M_string_length);
            if (iVar4 != 0) goto LAB_00269593;
          }
          uVar7 = std::__cxx11::string::_M_assign((string *)&local_180);
          local_190._M_allocated_capacity = CONCAT71((int7)((ulong)uVar7 >> 8),1);
          std::__cxx11::string::_M_assign((string *)&local_140);
        }
LAB_00269593:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != &local_1c8) {
          operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
        }
      }
      else {
        local_258._32_8_ = local_258 + 0x30;
        pcVar1 = (absFilename->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar1,pcVar1 + absFilename->_M_string_length);
        uVar10 = (undefined7)((ulong)extraout_RAX >> 8);
        bVar14 = true;
        if (local_2a0._M_string_length == local_280._M_string_length) {
          if (local_2a0._M_string_length == 0) {
            bVar14 = false;
            uVar10 = 0;
          }
          else {
            iVar4 = bcmp(local_2a0._M_dataplus._M_p,local_280._M_dataplus._M_p,
                         local_2a0._M_string_length);
            bVar14 = iVar4 != 0;
            uVar10 = (undefined7)(CONCAT44(extraout_var,iVar4) >> 8);
          }
        }
        if ((bool)(bVar14 | !bVar2)) {
          extractSubDir((string *)local_1d8,(string *)local_1b8,filename);
          findMatchingHeader((string *)local_258,(string *)local_1b8,(string *)local_1d8,&local_2a0,
                             local_198);
          if (local_258._8_8_ == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"AUTOGEN: error: ",0x10);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                                absFilename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,": The file includes the moc file \"",0x22);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_258._64_8_,(long)local_210);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       "\", which seems to be the moc file from a different source file. CMake also could not find a matching header.\n"
                       ,0x6d);
            std::endl<char,std::char_traits<char>>(poVar8);
            goto LAB_00269eb6;
          }
          std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          if ((bVar2) || (local_2a0._M_string_length != local_280._M_string_length)) {
LAB_0026964e:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"AUTOGEN: warning: ",0x12);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                                absFilename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,": The file includes the moc file \"",0x22);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_258._64_8_,(long)local_210);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" instead of \"moc_",0x12);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,".cpp\". Running moc on ",0x16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)CONCAT71(local_258._1_7_,local_258[0]),
                                local_258._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" ! Include \"moc_",0x11);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       ".cpp\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                       ,0x4a);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          }
          else {
            if (local_2a0._M_string_length != 0) {
              iVar4 = bcmp(local_2a0._M_dataplus._M_p,local_280._M_dataplus._M_p,
                           local_2a0._M_string_length);
              if (iVar4 != 0) goto LAB_0026964e;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"AUTOGEN: warning: ",0x12);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                                absFilename->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,": The file includes the moc file \"",0x22);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_258._64_8_,(long)local_210);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\", but does not contain a ",0x1a);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)local_1f8._0_8_,local_1f8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," macro. Running moc on ",0x17);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)CONCAT71(local_258._1_7_,local_258[0]),
                                local_258._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" ! Include \"moc_",0x11);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,
                       ".cpp\" for a compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                       ,0x4c);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
          }
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if ((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]) != local_258 + 0x10) {
            operator_delete((undefined1 *)CONCAT71(local_258._1_7_,local_258[0]),
                            local_258._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._0_8_ != &local_1c8) {
            operator_delete((void *)local_1d8._0_8_,local_1c8._0_8_ + 1);
          }
        }
        else {
          local_190._8_8_ = CONCAT71(uVar10,1);
          std::__cxx11::string::_M_assign((string *)&local_120);
        }
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_260,__return_storage_ptr__);
        std::__cxx11::string::_M_assign((string *)pmVar9);
      }
      if ((undefined1 *)local_258._32_8_ != local_258 + 0x30) {
        operator_delete((void *)local_258._32_8_,local_258._48_8_ + 1);
      }
      lVar12 = local_100._80_8_ - (long)local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._64_8_ != &local_208) {
        operator_delete((void *)local_258._64_8_,
                        CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) +
                        1);
      }
      lVar13 = lVar13 + lVar12;
      bVar14 = cmsys::RegularExpression::find
                         ((RegularExpression *)local_100,local_160._M_dataplus._M_p + lVar13);
    } while (bVar14);
    bVar14 = (local_190._8_8_ & 1) == 0;
    uVar7 = local_190._M_allocated_capacity;
  }
  if ((bVar2 & bVar14) == 1) {
    if ((uVar7 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"AUTOGEN: error: ",0x10);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                          absFilename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": The file ",0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"contains a ",0xb);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_1f8._0_8_,local_1f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," macro, but does not include ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_280._M_dataplus._M_p,local_280._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".moc\" !\n",8);
      std::endl<char,std::char_traits<char>>(poVar8);
LAB_00269eb6:
      exit(1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"AUTOGEN: warning: ",0x12);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(absFilename->_M_dataplus)._M_p,
                        absFilename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": The file ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"contains a ",0xb);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_1f8._0_8_,local_1f8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," macro, but does not include ",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_280._M_dataplus._M_p,local_280._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".moc\", but instead includes ",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_180._M_p,local_178);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\". Running moc on ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(absFilename->_M_dataplus)._M_p,absFilename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" ! Better include \"",0x14);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,local_280._M_dataplus._M_p,local_280._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,".moc\" for compatiblity with strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
               ,0x4a);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_260,absFilename);
    std::__cxx11::string::_M_assign((string *)pmVar9);
    pVar15 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range(local_260,&local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_aux(local_260,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p,
                    CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,
                    CONCAT71(local_170._M_allocated_capacity._1_7_,local_170._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ != &local_1e8) {
    operator_delete((void *)local_1f8._0_8_,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ != &local_1a8) {
    operator_delete((void *)local_1b8._0_8_,local_1a8._0_8_ + 1);
  }
LAB_00269c7b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_100._184_8_ != (char *)0x0) {
    operator_delete__((void *)local_100._184_8_);
  }
  return;
}

Assistant:

void cmQtAutoGenerators::ParseCppFile(const std::string& absFilename,
                const std::vector<std::string>& headerExtensions,
                std::map<std::string, std::string>& includedMocs,
                std::map<std::string, std::vector<std::string> > &includedUis)
{
  cmsys::RegularExpression mocIncludeRegExp(
              "[\n][ \t]*#[ \t]*include[ \t]+"
              "[\"<](([^ \">]+/)?moc_[^ \">/]+\\.cpp|[^ \">]+\\.moc)[\">]");

  const std::string contentsString = ReadAll(absFilename);
  if (contentsString.empty())
    {
    std::cerr << "AUTOGEN: warning: " << absFilename << ": file is empty\n"
              << std::endl;
    return;
    }
  this->ParseForUic(absFilename, contentsString, includedUis);
  if (this->MocExecutable.empty())
    {
    return;
    }

  const std::string absPath = cmsys::SystemTools::GetFilenamePath(
                   cmsys::SystemTools::GetRealPath(absFilename)) + '/';
  const std::string scannedFileBasename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFilename);
  std::string macroName;
  const bool requiresMoc = requiresMocing(contentsString, macroName);
  bool dotMocIncluded = false;
  bool mocUnderscoreIncluded = false;
  std::string ownMocUnderscoreFile;
  std::string ownDotMocFile;
  std::string ownMocHeaderFile;

  std::string::size_type matchOffset = 0;
  // first a simple string check for "moc" is *much* faster than the regexp,
  // and if the string search already fails, we don't have to try the
  // expensive regexp
  if ((strstr(contentsString.c_str(), "moc") != NULL)
                                    && (mocIncludeRegExp.find(contentsString)))
    {
    // for every moc include in the file
    do
      {
      const std::string currentMoc = mocIncludeRegExp.match(1);
      //std::cout << "found moc include: " << currentMoc << std::endl;

      std::string basename = cmsys::SystemTools::
                                   GetFilenameWithoutLastExtension(currentMoc);
      const bool moc_style = cmHasLiteralPrefix(basename, "moc_");

      // If the moc include is of the moc_foo.cpp style we expect
      // the Q_OBJECT class declaration in a header file.
      // If the moc include is of the foo.moc style we need to look for
      // a Q_OBJECT macro in the current source file, if it contains the
      // macro we generate the moc file from the source file.
      // Q_OBJECT
      if (moc_style)
        {
        // basename should be the part of the moc filename used for
        // finding the correct header, so we need to remove the moc_ part
        basename = basename.substr(4);
        std::string mocSubDir = extractSubDir(absPath, currentMoc);
        std::string headerToMoc = findMatchingHeader(
                               absPath, mocSubDir, basename, headerExtensions);

        if (!headerToMoc.empty())
          {
          includedMocs[headerToMoc] = currentMoc;
          if (basename == scannedFileBasename)
            {
            mocUnderscoreIncluded = true;
            ownMocUnderscoreFile = currentMoc;
            ownMocHeaderFile = headerToMoc;
            }
          }
        else
          {
          std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                    << "includes the moc file \"" << currentMoc << "\", "
                    << "but could not find header \"" << basename
                    << '{' << this->Join(headerExtensions, ',') << "}\" ";
          if (mocSubDir.empty())
            {
            std::cerr << "in " << absPath << "\n" << std::endl;
            }
          else
            {
            std::cerr << "neither in " << absPath
                      << " nor in " << mocSubDir << "\n" << std::endl;
            }

          ::exit(EXIT_FAILURE);
          }
        }
      else
        {
        std::string fileToMoc = absFilename;
        if ((basename != scannedFileBasename) || (requiresMoc==false))
          {
          std::string mocSubDir = extractSubDir(absPath, currentMoc);
          std::string headerToMoc = findMatchingHeader(
                              absPath, mocSubDir, basename, headerExtensions);
          if (!headerToMoc.empty())
            {
            // this is for KDE4 compatibility:
            fileToMoc = headerToMoc;
            if ((requiresMoc==false) &&(basename==scannedFileBasename))
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\", but does not contain a " << macroName
                            << " macro. Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for a compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            else
              {
              std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                            "includes the moc file \"" << currentMoc <<
                            "\" instead of \"moc_" << basename << ".cpp\". "
                            "Running moc on "
                        << "\"" << headerToMoc << "\" ! Include \"moc_"
                        << basename << ".cpp\" for compatiblity with "
                           "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                        << std::endl;
              }
            }
          else
            {
            std::cerr <<"AUTOGEN: error: " << absFilename << ": The file "
                        "includes the moc file \"" << currentMoc <<
                        "\", which seems to be the moc file from a different "
                        "source file. CMake also could not find a matching "
                        "header.\n" << std::endl;
            ::exit(EXIT_FAILURE);
            }
          }
        else
          {
          dotMocIncluded = true;
          ownDotMocFile = currentMoc;
          }
        includedMocs[fileToMoc] = currentMoc;
        }
      matchOffset += mocIncludeRegExp.end();
      } while(mocIncludeRegExp.find(contentsString.c_str() + matchOffset));
    }

  // In this case, check whether the scanned file itself contains a Q_OBJECT.
  // If this is the case, the moc_foo.cpp should probably be generated from
  // foo.cpp instead of foo.h, because otherwise it won't build.
  // But warn, since this is not how it is supposed to be used.
  if ((dotMocIncluded == false) && (requiresMoc == true))
    {
    if (mocUnderscoreIncluded == true)
      {
      // this is for KDE4 compatibility:
      std::cerr << "AUTOGEN: warning: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\", but instead "
                   "includes "
                << "\"" << ownMocUnderscoreFile  << "\". Running moc on "
                << "\"" << absFilename << "\" ! Better include \""
                << scannedFileBasename << ".moc\" for compatiblity with "
                   "strict mode (see CMAKE_AUTOMOC_RELAXED_MODE).\n"
                << std::endl;
      includedMocs[absFilename] = ownMocUnderscoreFile;
      includedMocs.erase(ownMocHeaderFile);
      }
    else
      {
      // otherwise always error out since it will not compile:
      std::cerr << "AUTOGEN: error: " << absFilename << ": The file "
                << "contains a " << macroName << " macro, but does not "
                "include "
                << "\"" << scannedFileBasename << ".moc\" !\n"
                << std::endl;
      ::exit(EXIT_FAILURE);
      }
    }

}